

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ilu_spanel_dfs.c
# Opt level: O2

void ilu_spanel_dfs(int m,int w,int jcol,SuperMatrix *A,int *perm_r,int *nseg,float *dense,
                   float *amax,int *panel_lsub,int *segrep,int *repfnz,int *marker,int *parent,
                   int_t *xplore,GlobalLU_t *Glu)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int *piVar8;
  int *piVar9;
  int_t *piVar10;
  int_t *piVar11;
  long lVar12;
  int *piVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  float fVar21;
  float fVar22;
  int local_9c;
  float *local_78;
  
  pvVar3 = A->Store;
  lVar4 = *(long *)((long)pvVar3 + 8);
  lVar5 = *(long *)((long)pvVar3 + 0x10);
  lVar6 = *(long *)((long)pvVar3 + 0x18);
  lVar7 = *(long *)((long)pvVar3 + 0x20);
  *nseg = 0;
  piVar8 = Glu->xsup;
  piVar9 = Glu->supno;
  piVar10 = Glu->lsub;
  piVar11 = Glu->xlsub;
  local_78 = dense;
  lVar20 = (long)jcol;
  do {
    if (w + jcol <= lVar20) {
      return;
    }
    *amax = 0.0;
    iVar19 = (int)lVar20;
    local_9c = (iVar19 - jcol) * m;
    for (lVar14 = (long)*(int *)(lVar6 + lVar20 * 4); lVar14 < *(int *)(lVar7 + lVar20 * 4);
        lVar14 = lVar14 + 1) {
      iVar17 = *(int *)(lVar5 + lVar14 * 4);
      fVar21 = *(float *)(lVar4 + lVar14 * 4);
      fVar22 = ABS(fVar21);
      if (*amax <= fVar22 && fVar22 != *amax) {
        *amax = fVar22;
        fVar21 = *(float *)(lVar4 + lVar14 * 4);
      }
      local_78[iVar17] = fVar21;
      if (marker[iVar17] != iVar19) {
        marker[iVar17] = iVar19;
        iVar18 = perm_r[iVar17];
        if ((long)iVar18 == -1) {
          lVar12 = (long)local_9c;
          local_9c = local_9c + 1;
          panel_lsub[lVar12] = iVar17;
        }
        else {
          iVar17 = piVar8[(long)piVar9[iVar18] + 1];
          lVar12 = (long)iVar17;
          if (repfnz[lVar12 + -1] == -1) {
            uVar16 = lVar12 - 1;
            parent[lVar12 + -1] = -1;
            repfnz[lVar12 + -1] = iVar18;
            piVar13 = piVar11 + piVar8[piVar9[lVar12 + -1]];
LAB_0010b767:
            iVar18 = *piVar13;
            iVar17 = piVar11[iVar17];
LAB_0010b770:
            lVar12 = (long)iVar18;
            do {
              iVar15 = (int)uVar16;
              iVar18 = (int)lVar12;
              if (iVar17 <= iVar18) {
                if (marker[(long)m + (long)iVar15] < jcol) {
                  segrep[*nseg] = iVar15;
                  *nseg = *nseg + 1;
                  marker[(long)m + (long)iVar15] = iVar19;
                }
                uVar16 = (ulong)parent[iVar15];
                if (uVar16 == 0xffffffffffffffff) goto LAB_0010b86e;
                piVar13 = xplore + uVar16;
                iVar17 = parent[iVar15] + 1;
                goto LAB_0010b767;
              }
              iVar1 = piVar10[lVar12];
              if (marker[iVar1] != iVar19) {
                marker[iVar1] = iVar19;
                iVar2 = perm_r[iVar1];
                if ((long)iVar2 == -1) {
                  lVar12 = (long)local_9c;
                  local_9c = local_9c + 1;
                  panel_lsub[lVar12] = iVar1;
                  iVar18 = iVar18 + 1;
                  goto LAB_0010b770;
                }
                iVar1 = piVar8[(long)piVar9[iVar2] + 1];
                if (repfnz[(long)iVar1 + -1] == -1) goto LAB_0010b7db;
                if (iVar2 < repfnz[(long)iVar1 + -1]) {
                  repfnz[(long)iVar1 + -1] = iVar2;
                }
              }
              lVar12 = lVar12 + 1;
            } while( true );
          }
          if (iVar18 < repfnz[lVar12 + -1]) {
            repfnz[lVar12 + -1] = iVar18;
          }
        }
      }
LAB_0010b86e:
    }
    repfnz = repfnz + m;
    local_78 = local_78 + m;
    amax = amax + 1;
    lVar20 = lVar20 + 1;
  } while( true );
LAB_0010b7db:
  xplore[iVar15] = iVar18 + 1;
  parent[(long)iVar1 + -1] = iVar15;
  repfnz[(long)iVar1 + -1] = iVar2;
  iVar18 = piVar11[piVar8[piVar9[(long)iVar1 + -1]]];
  iVar17 = piVar11[iVar1];
  uVar16 = (ulong)(iVar1 - 1);
  goto LAB_0010b770;
}

Assistant:

void
ilu_spanel_dfs(
   const int  m,	   /* in - number of rows in the matrix */
   const int  w,	   /* in */
   const int  jcol,	   /* in */
   SuperMatrix *A,	   /* in - original matrix */
   int	      *perm_r,	   /* in */
   int	      *nseg,	   /* out */
   float     *dense,	   /* out */
   float     *amax,	   /* out - max. abs. value of each column in panel */
   int	      *panel_lsub, /* out */
   int	      *segrep,	   /* out */
   int	      *repfnz,	   /* out */
   int	      *marker,	   /* out */
   int	      *parent,	   /* working array */
   int_t      *xplore,	   /* working array */
   GlobalLU_t *Glu	   /* modified */
)
{

    NCPformat *Astore;
    float    *a;
    int_t     *asub;
    int_t     *xa_begin, *xa_end;
    int       krep, chperm, chmark, chrep, oldrep, kchild, myfnz;
    int       krow, kmark, kperm, kpar;
    int_t     xdfs, maxdfs, k;
    int       jj;	   /* index through each column in the panel */
    int       *marker1;    /* marker1[jj] >= jcol if vertex jj was visited
			      by a previous column within this panel. */
    int       *repfnz_col; /* start of each column in the panel */
    float    *dense_col;  /* start of each column in the panel */
    int_t     nextl_col;   /* next available position in panel_lsub[*,jj] */
    int       *xsup, *supno;
    int_t     *lsub, *xlsub;
    float    *amax_col;
    register double tmp;

    /* Initialize pointers */
    Astore     = A->Store;
    a	       = Astore->nzval;
    asub       = Astore->rowind;
    xa_begin   = Astore->colbeg;
    xa_end     = Astore->colend;
    marker1    = marker + m;
    repfnz_col = repfnz;
    dense_col  = dense;
    amax_col   = amax;
    *nseg      = 0;
    xsup       = Glu->xsup;
    supno      = Glu->supno;
    lsub       = Glu->lsub;
    xlsub      = Glu->xlsub;

    /* For each column in the panel */
    for (jj = jcol; jj < jcol + w; jj++) {
	nextl_col = (jj - jcol) * m;

#ifdef CHK_DFS
	printf("\npanel col %d: ", jj);
#endif

	*amax_col = 0.0;
	/* For each nonz in A[*,jj] do dfs */
	for (k = xa_begin[jj]; k < xa_end[jj]; k++) {
	    krow = asub[k];
	    tmp = fabs(a[k]);
	    if (tmp > *amax_col) *amax_col = tmp;
	    dense_col[krow] = a[k];
	    kmark = marker[krow];
	    if ( kmark == jj )
		continue;     /* krow visited before, go to the next nonzero */

	    /* For each unmarked nbr krow of jj
	     * krow is in L: place it in structure of L[*,jj]
	     */
	    marker[krow] = jj;
	    kperm = perm_r[krow];

	    if ( kperm == SLU_EMPTY ) {
		panel_lsub[nextl_col++] = krow; /* krow is indexed into A */
	    }
	    /*
	     * krow is in U: if its supernode-rep krep
	     * has been explored, update repfnz[*]
	     */
	    else {
		
		krep = xsup[supno[kperm]+1] - 1;
		myfnz = repfnz_col[krep];
		
#ifdef CHK_DFS
		printf("krep %d, myfnz %d, perm_r[%d] %d\n", krep, myfnz, krow, kperm);
#endif
		if ( myfnz != SLU_EMPTY ) { /* Representative visited before */
		    if ( myfnz > kperm ) repfnz_col[krep] = kperm;
		    /* continue; */
		}
		else {
		    /* Otherwise, perform dfs starting at krep */
		    oldrep = SLU_EMPTY;
		    parent[krep] = oldrep;
		    repfnz_col[krep] = kperm;
		    xdfs = xlsub[xsup[supno[krep]]];
		    maxdfs = xlsub[krep + 1];

#ifdef CHK_DFS
		    printf("  xdfs %d, maxdfs %d: ", xdfs, maxdfs);
		    for (i = xdfs; i < maxdfs; i++) printf(" %d", lsub[i]);
		    printf("\n");
#endif
		    do {
			/*
			 * For each unmarked kchild of krep
			 */
			while ( xdfs < maxdfs ) {

			    kchild = lsub[xdfs];
			    xdfs++;
			    chmark = marker[kchild];

			    if ( chmark != jj ) { /* Not reached yet */
				marker[kchild] = jj;
				chperm = perm_r[kchild];

				/* Case kchild is in L: place it in L[*,j] */
				if ( chperm == SLU_EMPTY ) {
				    panel_lsub[nextl_col++] = kchild;
				}
				/* Case kchild is in U:
				 *   chrep = its supernode-rep. If its rep has
				 *   been explored, update its repfnz[*]
				 */
				else {
				    
				    chrep = xsup[supno[chperm]+1] - 1;
				    myfnz = repfnz_col[chrep];
#ifdef CHK_DFS
				    printf("chrep %d,myfnz %d,perm_r[%d] %d\n",chrep,myfnz,kchild,chperm);
#endif
				    if ( myfnz != SLU_EMPTY ) { /* Visited before */
					if ( myfnz > chperm )
					    repfnz_col[chrep] = chperm;
				    }
				    else {
					/* Cont. dfs at snode-rep of kchild */
					xplore[krep] = xdfs;
					oldrep = krep;
					krep = chrep; /* Go deeper down G(L) */
					parent[krep] = oldrep;
					repfnz_col[krep] = chperm;
					xdfs = xlsub[xsup[supno[krep]]];
					maxdfs = xlsub[krep + 1];
#ifdef CHK_DFS
					printf("  xdfs %d, maxdfs %d: ", xdfs, maxdfs);
					for (i = xdfs; i < maxdfs; i++) printf(" %d", lsub[i]);
					printf("\n");
#endif
				    } /* else */

				} /* else */

			    } /* if... */

			} /* while xdfs < maxdfs */

			/* krow has no more unexplored nbrs:
			 *    Place snode-rep krep in postorder DFS, if this
			 *    segment is seen for the first time. (Note that
			 *    "repfnz[krep]" may change later.)
			 *    Backtrack dfs to its parent.
			 */
			if ( marker1[krep] < jcol ) {
			    segrep[*nseg] = krep;
			    ++(*nseg);
			    marker1[krep] = jj;
			}

			kpar = parent[krep]; /* Pop stack, mimic recursion */
			if ( kpar == SLU_EMPTY ) break; /* dfs done */
			krep = kpar;
			xdfs = xplore[krep];
			maxdfs = xlsub[krep + 1];

#ifdef CHK_DFS
			printf("  pop stack: krep %d,xdfs %d,maxdfs %d: ", krep,xdfs,maxdfs);
			for (i = xdfs; i < maxdfs; i++) printf(" %d", lsub[i]);
			printf("\n");
#endif
		    } while ( kpar != SLU_EMPTY ); /* do-while - until empty stack */

		} /* else */
		
	    } /* else */

	} /* for each nonz in A[*,jj] */

	repfnz_col += m;    /* Move to next column */
	dense_col += m;
	amax_col++;

    } /* for jj ... */

}